

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldsInDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50.field_2._M_allocated_capacity._0_4_ = 0x6c656966;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x7364;
  local_50._M_string_length = 6;
  local_50.field_2._M_local_buf[6] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  io::Printer::Print<char[5],std::__cxx11::string>
            (this->printer_,"$list$=[\n",(char (*) [5])0x4162c6,&local_50);
  io::Printer::Indent(this->printer_);
  if (0 < *(int *)(message_descriptor + 4)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      PrintFieldDescriptor
                (this,(FieldDescriptor *)(*(long *)(message_descriptor + 0x28) + lVar2),false);
      io::Printer::Print<>(this->printer_,",\n");
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x48;
    } while (lVar1 < *(int *)(message_descriptor + 4));
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print<>(this->printer_,"],\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::PrintFieldsInDescriptor(
    const Descriptor& message_descriptor) const {
  const bool is_extension = false;
  PrintFieldDescriptorsInDescriptor(message_descriptor, is_extension, "fields",
                                    &Descriptor::field_count,
                                    &Descriptor::field);
}